

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O0

void print_skiplist(ion_skiplist_t *skiplist)

{
  uint uVar1;
  int value_1;
  char *key_1;
  int value;
  int key;
  ion_sl_level_t level;
  ion_sl_node_t *cursor;
  ion_skiplist_t *skiplist_local;
  
  for (_key = skiplist->head; *_key->next != (sl_node *)0x0; _key = *_key->next) {
    uVar1 = (*_key->next)->height + 1;
    if ((skiplist->super).key_type == key_type_numeric_signed) {
      printf("k: \'%d\' (v: \'%d\') [l: %d] -- ",(ulong)*(*_key->next)->key,
             (ulong)*(*_key->next)->value,(ulong)uVar1);
    }
    else if ((skiplist->super).key_type == key_type_null_terminated_string) {
      printf("k: \'%s\' (v: \'%d\') [l: %d] -- ",(*_key->next)->key,(ulong)*(*_key->next)->value,
             (ulong)uVar1);
    }
  }
  printf("%s","END\n\n");
  return;
}

Assistant:

void
print_skiplist(
	ion_skiplist_t *skiplist
) {
	ion_sl_node_t *cursor = skiplist->head;

	while (NULL != cursor->next[0]) {
		ion_sl_level_t level = cursor->next[0]->height + 1;

		if (key_type_numeric_signed == skiplist->super.key_type) {
			int key		= *((int *) cursor->next[0]->key);
			int value	= *(int *) cursor->next[0]->value;

			printf("k: '%d' (v: '%d') [l: %d] -- ", key, value, level);
		}
		else if (key_type_null_terminated_string == skiplist->super.key_type) {
			char	*key	= cursor->next[0]->key;
			int		value	= *(int *) cursor->next[0]->value;

			printf("k: '%s' (v: '%d') [l: %d] -- ", key, value, level);
		}

		cursor = cursor->next[0];
	}

	printf("%s", "END\n\n");
}